

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationalBayesEstimatorOnLDA.cpp
# Opt level: O0

void __thiscall
VariationalBayesEstimatorOnLDA::updateBeta
          (VariationalBayesEstimatorOnLDA *this,BetaUpdateManner manner)

{
  double dVar1;
  reference pvVar2;
  reference pvVar3;
  type tVar4;
  type tVar5;
  uint local_54;
  double dStack_50;
  int k_2;
  double numerator_1;
  int v_1;
  int k_1;
  double denominator_1;
  double commonBeta;
  int v;
  int k;
  double denominator;
  double numerator;
  VariationalBayesEstimatorOnLDA *pVStack_10;
  BetaUpdateManner manner_local;
  VariationalBayesEstimatorOnLDA *this_local;
  
  numerator._4_4_ = manner;
  pVStack_10 = this;
  if (manner == SYMMETRY) {
    denominator = 0.0;
    _v = 0.0;
    for (commonBeta._4_4_ = 0; commonBeta._4_4_ < this->_K; commonBeta._4_4_ = commonBeta._4_4_ + 1)
    {
      for (commonBeta._0_4_ = 0; commonBeta._0_4_ < this->_V;
          commonBeta._0_4_ = commonBeta._0_4_ + 1) {
        pvVar2 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&this->_nkv,(long)(int)commonBeta._4_4_);
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (pvVar2,(long)(int)commonBeta._0_4_);
        dVar1 = *pvVar3;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&this->_beta,(long)(int)commonBeta._0_4_);
        tVar4 = boost::math::digamma<double>(dVar1 + *pvVar3);
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&this->_beta,(long)(int)commonBeta._0_4_);
        tVar5 = boost::math::digamma<double>(*pvVar3);
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&this->_beta,(long)(int)commonBeta._0_4_);
        denominator = (tVar4 - tVar5) * *pvVar3 + denominator;
      }
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&this->_nk,(long)(int)commonBeta._4_4_);
      tVar4 = boost::math::digamma<double>(*pvVar3 + this->_betaSum);
      tVar5 = boost::math::digamma<double>(this->_betaSum);
      _v = (tVar4 - tVar5) + _v;
    }
    denominator_1 = (denominator / _v) / (double)this->_V;
    std::vector<double,_std::allocator<double>_>::assign
              (&this->_beta,(ulong)this->_V,&denominator_1);
  }
  else {
    _v_1 = 0.0;
    for (numerator_1._4_4_ = 0; numerator_1._4_4_ < this->_K;
        numerator_1._4_4_ = numerator_1._4_4_ + 1) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&this->_nk,(long)(int)numerator_1._4_4_);
      tVar4 = boost::math::digamma<double>(*pvVar3 + this->_betaSum);
      tVar5 = boost::math::digamma<double>(this->_betaSum);
      _v_1 = (tVar4 - tVar5) + _v_1;
    }
    for (numerator_1._0_4_ = 0; numerator_1._0_4_ < this->_V;
        numerator_1._0_4_ = numerator_1._0_4_ + 1) {
      dStack_50 = 0.0;
      for (local_54 = 0; local_54 < this->_K; local_54 = local_54 + 1) {
        pvVar2 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&this->_nkv,(long)(int)local_54);
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (pvVar2,(long)(int)numerator_1._0_4_);
        dVar1 = *pvVar3;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&this->_beta,(long)(int)numerator_1._0_4_);
        tVar4 = boost::math::digamma<double>(dVar1 + *pvVar3);
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&this->_beta,(long)(int)numerator_1._0_4_);
        tVar5 = boost::math::digamma<double>(*pvVar3);
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&this->_beta,(long)(int)numerator_1._0_4_);
        dStack_50 = (tVar4 - tVar5) * *pvVar3 + dStack_50;
      }
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&this->_beta,(long)(int)numerator_1._0_4_);
      *pvVar3 = dStack_50 / _v_1;
    }
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&this->_betaTimeSeries,&this->_beta);
  return;
}

Assistant:

void VariationalBayesEstimatorOnLDA::updateBeta(BetaUpdateManner manner){//{{{
    if(manner == SYMMETRY){
        double numerator=0;
        double denominator=0;
        for(int k=0;k<_K;k++){
            for(int v=0;v<_V;v++){
                numerator += (boost::math::digamma(_nkv[k][v]+_beta[v]) - boost::math::digamma(_beta[v]))*_beta[v];
            }
            denominator += boost::math::digamma(_nk[k]+_betaSum) - boost::math::digamma(_betaSum);
        }
        double commonBeta = numerator/denominator/_V;
        _beta.assign(_V, commonBeta);
    }else{
        double denominator=0;
        for(int k=0;k<_K;k++){
            denominator += boost::math::digamma(_nk[k]+_betaSum) - boost::math::digamma(_betaSum);
        }
        for(int v=0;v<_V;v++){
            double numerator=0;
            for(int k=0;k<_K;k++){
                try{
                    numerator += (boost::math::digamma(_nkv[k][v]+_beta[v])-boost::math::digamma(_beta[v]))*_beta[v];
                }catch(...){
                    numerator += 0;
                }
            }
            _beta[v] = numerator/denominator;
        }
    }
    _betaTimeSeries.push_back(_beta);
}